

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O2

void Timidity::Parse_lart
               (DLS_Data *data,RIFF_Chunk *chunk,CONNECTIONLIST **conn_ptr,CONNECTION **connList_ptr
               )

{
  uint uVar1;
  POOLTABLE PVar2;
  ULONG UVar3;
  POOLTABLE *pPVar4;
  
  pPVar4 = (POOLTABLE *)&data->ptbl;
  while( true ) {
    PVar2 = *pPVar4;
    if (PVar2 == (POOLTABLE)0x0) {
      return;
    }
    UVar3 = *(ULONG *)PVar2;
    if (UVar3 == 0x5453494c) {
      UVar3 = ((POOLTABLE *)((long)PVar2 + 8))->cbSize;
    }
    if ((UVar3 == 0x32747261) || (UVar3 == 0x31747261)) break;
    pPVar4 = (POOLTABLE *)((long)PVar2 + 0x20);
  }
  PVar2 = *(POOLTABLE *)((long)PVar2 + 0x10);
  uVar1 = *(uint *)PVar2;
  chunk->magic = PVar2.cbSize;
  chunk->length = PVar2.cCues;
  *conn_ptr = (CONNECTIONLIST *)((ulong)uVar1 + (long)PVar2);
  return;
}

Assistant:

static void Parse_lart(DLS_Data *data, RIFF_Chunk *chunk, CONNECTIONLIST **conn_ptr, CONNECTION **connList_ptr)
{
	/* FIXME: This only supports one set of connections */
	for ( chunk = chunk->child; chunk; chunk = chunk->next ) {
		DWORD magic = (chunk->magic == FOURCC_LIST) ? chunk->subtype : chunk->magic;
		switch(magic) {
			case FOURCC_ART1:
			case FOURCC_ART2:
				Parse_art(data, chunk, conn_ptr, connList_ptr);
				return;
		}
	}
}